

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O3

boolean compress_first_pass(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JCOEF JVar1;
  uint uVar2;
  jpeg_c_coef_controller *pjVar3;
  forward_DCT_ptr p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  boolean bVar11;
  JBLOCKARRAY ppaJVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  jvirt_barray_ptr input_buf_00;
  uint uVar17;
  ulong uVar18;
  jvirt_barray_ptr pjVar19;
  JBLOCKROW paJVar20;
  uint uVar21;
  ulong uVar22;
  JBLOCKROW __s;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar51;
  int iVar58;
  int iVar59;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar60;
  undefined1 auVar57 [16];
  int iVar61;
  int iVar65;
  undefined1 in_XMM7 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 in_XMM9 [16];
  int iVar70;
  undefined1 auVar69 [16];
  int iVar71;
  long lVar27;
  
  input_buf_00 = (jvirt_barray_ptr)input_buf;
  if (0 < cinfo->num_components) {
    uVar10 = cinfo->total_iMCU_rows - 1;
    pjVar19 = (jvirt_barray_ptr)cinfo->comp_info;
    pjVar3 = cinfo->coef;
    lVar15 = 0;
    do {
      input_buf_00 = (jvirt_barray_ptr)(&pjVar3[7].start_pass)[lVar15];
      ppaJVar12 = (*cinfo->mem->access_virt_barray)
                            ((j_common_ptr)cinfo,input_buf_00,
                             *(int *)&pjVar3[1].start_pass * pjVar19->blocksperrow,
                             pjVar19->blocksperrow,1);
      uVar17 = *(uint *)&pjVar3[1].start_pass;
      if (uVar17 < uVar10) {
        uVar18 = (ulong)pjVar19->blocksperrow;
      }
      else {
        input_buf_00 = (jvirt_barray_ptr)(ulong)pjVar19->blocksperrow;
        uVar18 = (ulong)pjVar19->first_undef_row % (ulong)input_buf_00;
        if ((int)uVar18 == 0) {
          uVar18 = (ulong)pjVar19->blocksperrow;
        }
      }
      uVar21 = pjVar19->cur_start_row;
      uVar13 = (ulong)uVar21;
      uVar2 = pjVar19->rows_in_array;
      iVar58 = (int)(uVar13 % (ulong)uVar2);
      uVar22 = (ulong)(uVar2 - iVar58);
      if (iVar58 < 1) {
        uVar22 = uVar13 % (ulong)uVar2;
      }
      iVar58 = (int)uVar18;
      iVar60 = (int)uVar22;
      if (0 < iVar58) {
        p_Var4 = cinfo->fdct->forward_DCT[lVar15];
        lVar14 = uVar22 - 1;
        auVar69._8_4_ = (int)lVar14;
        auVar69._0_8_ = lVar14;
        auVar69._12_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar69 = auVar69 ^ _DAT_00219ba0;
        uVar23 = 0;
        do {
          paJVar20 = ppaJVar12[uVar23];
          input_buf_00 = pjVar19;
          (*p_Var4)(cinfo,(jpeg_component_info *)pjVar19,input_buf[lVar15],paJVar20,
                    pjVar19->dirty * (int)uVar23,0,uVar21);
          if (0 < iVar60) {
            memset(paJVar20 + uVar13,0,uVar22 << 7);
            in_XMM9 = _DAT_00219ba0;
            auVar38._8_4_ = 0xffffffff;
            auVar38._0_8_ = 0xffffffffffffffff;
            auVar38._12_4_ = 0xffffffff;
            JVar1 = paJVar20[uVar13 - 1][0];
            lVar14 = 0;
            auVar24 = _DAT_00219b90;
            auVar28 = _DAT_00219b80;
            auVar30 = _DAT_002307a0;
            auVar32 = _DAT_00230790;
            do {
              auVar34 = auVar24 ^ in_XMM9;
              iVar61 = auVar69._0_4_;
              iVar51 = -(uint)(iVar61 < auVar34._0_4_);
              iVar65 = auVar69._4_4_;
              auVar35._4_4_ = -(uint)(iVar65 < auVar34._4_4_);
              iVar70 = auVar69._8_4_;
              iVar59 = -(uint)(iVar70 < auVar34._8_4_);
              iVar71 = auVar69._12_4_;
              auVar35._12_4_ = -(uint)(iVar71 < auVar34._12_4_);
              auVar42._4_4_ = iVar51;
              auVar42._0_4_ = iVar51;
              auVar42._8_4_ = iVar59;
              auVar42._12_4_ = iVar59;
              auVar62 = pshuflw(in_XMM7,auVar42,0xe8);
              auVar40._4_4_ = -(uint)(auVar34._4_4_ == iVar65);
              auVar40._12_4_ = -(uint)(auVar34._12_4_ == iVar71);
              auVar40._0_4_ = auVar40._4_4_;
              auVar40._8_4_ = auVar40._12_4_;
              auVar66 = pshuflw(in_XMM8,auVar40,0xe8);
              auVar35._0_4_ = auVar35._4_4_;
              auVar35._8_4_ = auVar35._12_4_;
              auVar34 = pshuflw(auVar62,auVar35,0xe8);
              auVar34 = (auVar34 | auVar66 & auVar62) ^ auVar38;
              auVar34 = packssdw(auVar34,auVar34);
              if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar13] + lVar14) = JVar1;
              }
              auVar35 = auVar40 & auVar42 | auVar35;
              auVar34 = packssdw(auVar35,auVar35);
              auVar34 = packssdw(auVar34 ^ auVar38,auVar34 ^ auVar38);
              if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
                *(JCOEF *)((long)paJVar20[uVar13 + 1] + lVar14) = JVar1;
              }
              auVar40 = auVar28 ^ in_XMM9;
              iVar51 = -(uint)(iVar61 < auVar40._0_4_);
              auVar52._4_4_ = -(uint)(iVar65 < auVar40._4_4_);
              iVar59 = -(uint)(iVar70 < auVar40._8_4_);
              auVar52._12_4_ = -(uint)(iVar71 < auVar40._12_4_);
              auVar34._4_4_ = iVar51;
              auVar34._0_4_ = iVar51;
              auVar34._8_4_ = iVar59;
              auVar34._12_4_ = iVar59;
              auVar41._4_4_ = -(uint)(auVar40._4_4_ == iVar65);
              auVar41._12_4_ = -(uint)(auVar40._12_4_ == iVar71);
              auVar41._0_4_ = auVar41._4_4_;
              auVar41._8_4_ = auVar41._12_4_;
              auVar52._0_4_ = auVar52._4_4_;
              auVar52._8_4_ = auVar52._12_4_;
              auVar40 = auVar41 & auVar34 | auVar52;
              auVar40 = packssdw(auVar40,auVar40);
              auVar40 = packssdw(auVar40 ^ auVar38,auVar40 ^ auVar38);
              if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar13 + 2] + lVar14) = JVar1;
              }
              auVar34 = pshufhw(auVar34,auVar34,0x84);
              auVar42 = pshufhw(auVar41,auVar41,0x84);
              auVar35 = pshufhw(auVar34,auVar52,0x84);
              auVar34 = (auVar35 | auVar42 & auVar34) ^ auVar38;
              auVar34 = packssdw(auVar34,auVar34);
              if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar13 + 3] + lVar14) = JVar1;
              }
              auVar34 = auVar30 ^ in_XMM9;
              iVar51 = -(uint)(iVar61 < auVar34._0_4_);
              auVar37._4_4_ = -(uint)(iVar65 < auVar34._4_4_);
              iVar59 = -(uint)(iVar70 < auVar34._8_4_);
              auVar37._12_4_ = -(uint)(iVar71 < auVar34._12_4_);
              auVar43._4_4_ = iVar51;
              auVar43._0_4_ = iVar51;
              auVar43._8_4_ = iVar59;
              auVar43._12_4_ = iVar59;
              auVar40 = pshuflw(auVar40,auVar43,0xe8);
              auVar36._4_4_ = -(uint)(auVar34._4_4_ == iVar65);
              auVar36._12_4_ = -(uint)(auVar34._12_4_ == iVar71);
              auVar36._0_4_ = auVar36._4_4_;
              auVar36._8_4_ = auVar36._12_4_;
              in_XMM8 = pshuflw(auVar66 & auVar62,auVar36,0xe8);
              in_XMM8 = in_XMM8 & auVar40;
              auVar37._0_4_ = auVar37._4_4_;
              auVar37._8_4_ = auVar37._12_4_;
              auVar34 = pshuflw(auVar40,auVar37,0xe8);
              auVar34 = (auVar34 | in_XMM8) ^ auVar38;
              auVar34 = packssdw(auVar34,auVar34);
              if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar13 + 4] + lVar14) = JVar1;
              }
              auVar37 = auVar36 & auVar43 | auVar37;
              auVar34 = packssdw(auVar37,auVar37);
              auVar34 = packssdw(auVar34 ^ auVar38,auVar34 ^ auVar38);
              if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar13 + 5] + lVar14) = JVar1;
              }
              auVar34 = auVar32 ^ in_XMM9;
              iVar51 = -(uint)(iVar61 < auVar34._0_4_);
              auVar53._4_4_ = -(uint)(iVar65 < auVar34._4_4_);
              iVar59 = -(uint)(iVar70 < auVar34._8_4_);
              auVar53._12_4_ = -(uint)(iVar71 < auVar34._12_4_);
              auVar62._4_4_ = iVar51;
              auVar62._0_4_ = iVar51;
              auVar62._8_4_ = iVar59;
              auVar62._12_4_ = iVar59;
              auVar66._4_4_ = -(uint)(auVar34._4_4_ == iVar65);
              auVar66._12_4_ = -(uint)(auVar34._12_4_ == iVar71);
              auVar66._0_4_ = auVar66._4_4_;
              auVar66._8_4_ = auVar66._12_4_;
              auVar53._0_4_ = auVar53._4_4_;
              auVar53._8_4_ = auVar53._12_4_;
              auVar34 = auVar66 & auVar62 | auVar53;
              auVar34 = packssdw(auVar34,auVar34);
              in_XMM7 = packssdw(auVar34 ^ auVar38,auVar34 ^ auVar38);
              if ((in_XMM7 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar13 + 6] + lVar14) = JVar1;
              }
              auVar34 = pshufhw(auVar62,auVar62,0x84);
              auVar35 = pshufhw(auVar66,auVar66,0x84);
              auVar40 = pshufhw(auVar34,auVar53,0x84);
              auVar34 = (auVar40 | auVar35 & auVar34) ^ auVar38;
              auVar34 = packssdw(auVar34,auVar34);
              input_buf_00 = (jvirt_barray_ptr)(ulong)auVar34._14_2_;
              if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar13 + 7] + lVar14) = JVar1;
              }
              lVar16 = auVar24._8_8_;
              auVar24._0_8_ = auVar24._0_8_ + 8;
              auVar24._8_8_ = lVar16 + 8;
              lVar16 = auVar28._8_8_;
              auVar28._0_8_ = auVar28._0_8_ + 8;
              auVar28._8_8_ = lVar16 + 8;
              lVar16 = auVar30._8_8_;
              auVar30._0_8_ = auVar30._0_8_ + 8;
              auVar30._8_8_ = lVar16 + 8;
              lVar16 = auVar32._8_8_;
              auVar32._0_8_ = auVar32._0_8_ + 8;
              auVar32._8_8_ = lVar16 + 8;
              lVar14 = lVar14 + 0x400;
            } while ((ulong)(iVar60 + 7U >> 3) << 10 != lVar14);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar18);
        uVar17 = *(uint *)&pjVar3[1].start_pass;
      }
      if (uVar17 == uVar10) {
        uVar21 = iVar60 + uVar21;
        if (iVar58 < (int)pjVar19->blocksperrow) {
          lVar16 = (long)iVar58;
          lVar14 = (ulong)uVar2 - 1;
          auVar25._8_4_ = (int)lVar14;
          auVar25._0_8_ = lVar14;
          auVar25._12_4_ = (int)((ulong)lVar14 >> 0x20);
          do {
            paJVar20 = ppaJVar12[lVar16 + -1];
            __s = ppaJVar12[lVar16];
            input_buf_00 = (jvirt_barray_ptr)0x0;
            memset(__s,0,(ulong)uVar21 << 7);
            auVar32 = _DAT_002307a0;
            auVar30 = _DAT_00230790;
            auVar28 = _DAT_00219ba0;
            auVar24 = _DAT_00219b90;
            auVar69 = _DAT_00219b80;
            if (uVar2 <= uVar21) {
              uVar17 = 0;
              do {
                if (0 < (int)uVar2) {
                  JVar1 = paJVar20[(long)(int)uVar2 + -1][0];
                  lVar14 = 0;
                  auVar26 = auVar24;
                  auVar29 = auVar69;
                  auVar31 = auVar32;
                  auVar33 = auVar30;
                  do {
                    auVar38 = auVar25 ^ auVar28;
                    auVar34 = auVar26 ^ auVar28;
                    iVar58 = auVar38._0_4_;
                    iVar61 = -(uint)(iVar58 < auVar34._0_4_);
                    iVar60 = auVar38._4_4_;
                    auVar45._4_4_ = -(uint)(iVar60 < auVar34._4_4_);
                    iVar51 = auVar38._8_4_;
                    iVar65 = -(uint)(iVar51 < auVar34._8_4_);
                    iVar59 = auVar38._12_4_;
                    auVar45._12_4_ = -(uint)(iVar59 < auVar34._12_4_);
                    auVar54._4_4_ = iVar61;
                    auVar54._0_4_ = iVar61;
                    auVar54._8_4_ = iVar65;
                    auVar54._12_4_ = iVar65;
                    auVar38 = pshuflw(in_XMM8,auVar54,0xe8);
                    auVar44._4_4_ = -(uint)(auVar34._4_4_ == iVar60);
                    auVar44._12_4_ = -(uint)(auVar34._12_4_ == iVar59);
                    auVar44._0_4_ = auVar44._4_4_;
                    auVar44._8_4_ = auVar44._12_4_;
                    auVar40 = pshuflw(in_XMM9,auVar44,0xe8);
                    auVar45._0_4_ = auVar45._4_4_;
                    auVar45._8_4_ = auVar45._12_4_;
                    auVar34 = pshuflw(auVar38,auVar45,0xe8);
                    auVar67._8_4_ = 0xffffffff;
                    auVar67._0_8_ = 0xffffffffffffffff;
                    auVar67._12_4_ = 0xffffffff;
                    auVar67 = (auVar34 | auVar40 & auVar38) ^ auVar67;
                    auVar34 = packssdw(auVar67,auVar67);
                    if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)*__s + lVar14) = JVar1;
                    }
                    auVar45 = auVar44 & auVar54 | auVar45;
                    auVar34 = packssdw(auVar45,auVar45);
                    auVar5._8_4_ = 0xffffffff;
                    auVar5._0_8_ = 0xffffffffffffffff;
                    auVar5._12_4_ = 0xffffffff;
                    auVar34 = packssdw(auVar34 ^ auVar5,auVar34 ^ auVar5);
                    if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
                      *(JCOEF *)((long)__s[1] + lVar14) = JVar1;
                    }
                    auVar34 = auVar29 ^ auVar28;
                    iVar61 = -(uint)(iVar58 < auVar34._0_4_);
                    auVar63._4_4_ = -(uint)(iVar60 < auVar34._4_4_);
                    iVar65 = -(uint)(iVar51 < auVar34._8_4_);
                    auVar63._12_4_ = -(uint)(iVar59 < auVar34._12_4_);
                    auVar46._4_4_ = iVar61;
                    auVar46._0_4_ = iVar61;
                    auVar46._8_4_ = iVar65;
                    auVar46._12_4_ = iVar65;
                    auVar55._4_4_ = -(uint)(auVar34._4_4_ == iVar60);
                    auVar55._12_4_ = -(uint)(auVar34._12_4_ == iVar59);
                    auVar55._0_4_ = auVar55._4_4_;
                    auVar55._8_4_ = auVar55._12_4_;
                    auVar63._0_4_ = auVar63._4_4_;
                    auVar63._8_4_ = auVar63._12_4_;
                    auVar34 = auVar55 & auVar46 | auVar63;
                    auVar34 = packssdw(auVar34,auVar34);
                    auVar6._8_4_ = 0xffffffff;
                    auVar6._0_8_ = 0xffffffffffffffff;
                    auVar6._12_4_ = 0xffffffff;
                    auVar34 = packssdw(auVar34 ^ auVar6,auVar34 ^ auVar6);
                    if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)__s[2] + lVar14) = JVar1;
                    }
                    auVar35 = pshufhw(auVar46,auVar46,0x84);
                    auVar62 = pshufhw(auVar55,auVar55,0x84);
                    auVar42 = pshufhw(auVar35,auVar63,0x84);
                    auVar47._8_4_ = 0xffffffff;
                    auVar47._0_8_ = 0xffffffffffffffff;
                    auVar47._12_4_ = 0xffffffff;
                    auVar47 = (auVar42 | auVar62 & auVar35) ^ auVar47;
                    auVar35 = packssdw(auVar47,auVar47);
                    if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)__s[3] + lVar14) = JVar1;
                    }
                    auVar35 = auVar31 ^ auVar28;
                    iVar61 = -(uint)(iVar58 < auVar35._0_4_);
                    auVar49._4_4_ = -(uint)(iVar60 < auVar35._4_4_);
                    iVar65 = -(uint)(iVar51 < auVar35._8_4_);
                    auVar49._12_4_ = -(uint)(iVar59 < auVar35._12_4_);
                    auVar56._4_4_ = iVar61;
                    auVar56._0_4_ = iVar61;
                    auVar56._8_4_ = iVar65;
                    auVar56._12_4_ = iVar65;
                    auVar34 = pshuflw(auVar34,auVar56,0xe8);
                    auVar48._4_4_ = -(uint)(auVar35._4_4_ == iVar60);
                    auVar48._12_4_ = -(uint)(auVar35._12_4_ == iVar59);
                    auVar48._0_4_ = auVar48._4_4_;
                    auVar48._8_4_ = auVar48._12_4_;
                    in_XMM9 = pshuflw(auVar40 & auVar38,auVar48,0xe8);
                    in_XMM9 = in_XMM9 & auVar34;
                    auVar49._0_4_ = auVar49._4_4_;
                    auVar49._8_4_ = auVar49._12_4_;
                    auVar38 = pshuflw(auVar34,auVar49,0xe8);
                    auVar68._8_4_ = 0xffffffff;
                    auVar68._0_8_ = 0xffffffffffffffff;
                    auVar68._12_4_ = 0xffffffff;
                    auVar68 = (auVar38 | in_XMM9) ^ auVar68;
                    auVar38 = packssdw(auVar68,auVar68);
                    if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)__s[4] + lVar14) = JVar1;
                    }
                    auVar49 = auVar48 & auVar56 | auVar49;
                    auVar38 = packssdw(auVar49,auVar49);
                    auVar7._8_4_ = 0xffffffff;
                    auVar7._0_8_ = 0xffffffffffffffff;
                    auVar7._12_4_ = 0xffffffff;
                    auVar38 = packssdw(auVar38 ^ auVar7,auVar38 ^ auVar7);
                    if ((auVar38 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)__s[5] + lVar14) = JVar1;
                    }
                    auVar38 = auVar33 ^ auVar28;
                    auVar64._0_4_ = -(uint)(iVar58 < auVar38._0_4_);
                    auVar64._4_4_ = -(uint)(iVar60 < auVar38._4_4_);
                    auVar64._8_4_ = -(uint)(iVar51 < auVar38._8_4_);
                    auVar64._12_4_ = -(uint)(iVar59 < auVar38._12_4_);
                    auVar50._4_4_ = auVar64._0_4_;
                    auVar50._0_4_ = auVar64._0_4_;
                    auVar50._8_4_ = auVar64._8_4_;
                    auVar50._12_4_ = auVar64._8_4_;
                    iVar58 = -(uint)(auVar38._4_4_ == iVar60);
                    iVar60 = -(uint)(auVar38._12_4_ == iVar59);
                    auVar39._4_4_ = iVar58;
                    auVar39._0_4_ = iVar58;
                    auVar39._8_4_ = iVar60;
                    auVar39._12_4_ = iVar60;
                    auVar57._4_4_ = auVar64._4_4_;
                    auVar57._0_4_ = auVar64._4_4_;
                    auVar57._8_4_ = auVar64._12_4_;
                    auVar57._12_4_ = auVar64._12_4_;
                    in_XMM8 = auVar39 & auVar50 | auVar57;
                    auVar38 = packssdw(auVar64,in_XMM8);
                    auVar8._8_4_ = 0xffffffff;
                    auVar8._0_8_ = 0xffffffffffffffff;
                    auVar8._12_4_ = 0xffffffff;
                    in_XMM7 = packssdw(auVar38 ^ auVar8,auVar38 ^ auVar8);
                    if ((in_XMM7 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)__s[6] + lVar14) = JVar1;
                    }
                    auVar34 = pshufhw(auVar50,auVar50,0x84);
                    auVar38 = pshufhw(auVar39,auVar39,0x84);
                    auVar40 = pshufhw(auVar34,auVar57,0x84);
                    auVar9._8_4_ = 0xffffffff;
                    auVar9._0_8_ = 0xffffffffffffffff;
                    auVar9._12_4_ = 0xffffffff;
                    auVar38 = packssdw(auVar38 & auVar34,(auVar40 | auVar38 & auVar34) ^ auVar9);
                    input_buf_00 = (jvirt_barray_ptr)(ulong)auVar38._14_2_;
                    if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)__s[7] + lVar14) = JVar1;
                    }
                    lVar27 = auVar26._8_8_;
                    auVar26._0_8_ = auVar26._0_8_ + 8;
                    auVar26._8_8_ = lVar27 + 8;
                    lVar27 = auVar29._8_8_;
                    auVar29._0_8_ = auVar29._0_8_ + 8;
                    auVar29._8_8_ = lVar27 + 8;
                    lVar27 = auVar31._8_8_;
                    auVar31._0_8_ = auVar31._0_8_ + 8;
                    auVar31._8_8_ = lVar27 + 8;
                    lVar27 = auVar33._8_8_;
                    auVar33._0_8_ = auVar33._0_8_ + 8;
                    auVar33._8_8_ = lVar27 + 8;
                    lVar14 = lVar14 + 0x400;
                  } while ((ulong)(uVar2 + 7 >> 3) << 10 != lVar14);
                }
                paJVar20 = paJVar20 + (int)uVar2;
                uVar17 = uVar17 + 1;
                __s = __s + (int)uVar2;
              } while (uVar17 < uVar21 / uVar2);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < (int)pjVar19->blocksperrow);
        }
      }
      lVar15 = lVar15 + 1;
      pjVar19 = (jvirt_barray_ptr)((pjVar19->b_s_info).temp_name + 8);
    } while (lVar15 < cinfo->num_components);
  }
  bVar11 = compress_output(cinfo,(JSAMPIMAGE)input_buf_00);
  return bVar11;
}

Assistant:

METHODDEF(boolean)
compress_first_pass (j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION blocks_across, MCUs_across, MCUindex;
  int bi, ci, h_samp_factor, block_row, block_rows, ndummy;
  JCOEF lastDC;
  jpeg_component_info *compptr;
  JBLOCKARRAY buffer;
  JBLOCKROW thisblockrow, lastblockrow;
  forward_DCT_ptr forward_DCT;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Align the virtual buffer for this component. */
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[ci],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, TRUE);
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (coef->iMCU_row_num < last_iMCU_row)
      block_rows = compptr->v_samp_factor;
    else {
      /* NB: can't use last_row_height here, since may not be set! */
      block_rows = (int) (compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
    }
    blocks_across = compptr->width_in_blocks;
    h_samp_factor = compptr->h_samp_factor;
    /* Count number of dummy blocks to be added at the right margin. */
    ndummy = (int) (blocks_across % h_samp_factor);
    if (ndummy > 0)
      ndummy = h_samp_factor - ndummy;
    forward_DCT = cinfo->fdct->forward_DCT[ci];
    /* Perform DCT for all non-dummy blocks in this iMCU row.  Each call
     * on forward_DCT processes a complete horizontal row of DCT blocks.
     */
    for (block_row = 0; block_row < block_rows; block_row++) {
      thisblockrow = buffer[block_row];
      (*forward_DCT) (cinfo, compptr, input_buf[ci], thisblockrow,
		      (JDIMENSION) (block_row * compptr->DCT_v_scaled_size),
		      (JDIMENSION) 0, blocks_across);
      if (ndummy > 0) {
	/* Create dummy blocks at the right edge of the image. */
	thisblockrow += blocks_across; /* => first dummy block */
	FMEMZERO((void FAR *) thisblockrow, ndummy * SIZEOF(JBLOCK));
	lastDC = thisblockrow[-1][0];
	for (bi = 0; bi < ndummy; bi++) {
	  thisblockrow[bi][0] = lastDC;
	}
      }
    }
    /* If at end of image, create dummy block rows as needed.
     * The tricky part here is that within each MCU, we want the DC values
     * of the dummy blocks to match the last real block's DC value.
     * This squeezes a few more bytes out of the resulting file...
     */
    if (coef->iMCU_row_num == last_iMCU_row) {
      blocks_across += ndummy;	/* include lower right corner */
      MCUs_across = blocks_across / h_samp_factor;
      for (block_row = block_rows; block_row < compptr->v_samp_factor;
	   block_row++) {
	thisblockrow = buffer[block_row];
	lastblockrow = buffer[block_row-1];
	FMEMZERO((void FAR *) thisblockrow,
		 (size_t) (blocks_across * SIZEOF(JBLOCK)));
	for (MCUindex = 0; MCUindex < MCUs_across; MCUindex++) {
	  lastDC = lastblockrow[h_samp_factor-1][0];
	  for (bi = 0; bi < h_samp_factor; bi++) {
	    thisblockrow[bi][0] = lastDC;
	  }
	  thisblockrow += h_samp_factor; /* advance to next MCU in row */
	  lastblockrow += h_samp_factor;
	}
      }
    }
  }
  /* NB: compress_output will increment iMCU_row_num if successful.
   * A suspension return will result in redoing all the work above next time.
   */

  /* Emit data to the entropy encoder, sharing code with subsequent passes */
  return compress_output(cinfo, input_buf);
}